

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

int auth_kbdint_responses(AuthPolicy *ap,ptrlen *responses)

{
  _Bool _Var1;
  ptrlen *responses_local;
  AuthPolicy *ap_local;
  
  if (ap->kbdint_state == 0) {
    _Var1 = ptrlen_eq_string(*responses,"stoat");
    if ((_Var1) && (_Var1 = ptrlen_eq_string(responses[1],"weasel"), _Var1)) {
      ap->kbdint_state = ap->kbdint_state + 1;
      ap_local._4_4_ = 0;
    }
    else {
      ap->kbdint_state = 0;
      ap_local._4_4_ = -1;
    }
  }
  else if (ap->kbdint_state == 1) {
    ap_local._4_4_ = 1;
  }
  else {
    ap->kbdint_state = 0;
    ap_local._4_4_ = -1;
  }
  return ap_local._4_4_;
}

Assistant:

int auth_kbdint_responses(AuthPolicy *ap, const ptrlen *responses)
{
    switch (ap->kbdint_state) {
      case 0:
        if (ptrlen_eq_string(responses[0], "stoat") &&
            ptrlen_eq_string(responses[1], "weasel")) {
            ap->kbdint_state++;
            return 0;                  /* those are the expected responses */
        } else {
            ap->kbdint_state = 0;
            return -1;
        }
        break;
      case 1:
        return +1;                     /* succeed after the zero-prompt step */
      default:
        ap->kbdint_state = 0;
        return -1;
    }
}